

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O0

int __thiscall HighsLinearSumBounds::remove(HighsLinearSumBounds *this,char *__filename)

{
  double *pdVar1;
  reference pvVar2;
  HighsCDouble *pHVar3;
  int in_EDX;
  int iVar4;
  double in_XMM0_Qa;
  double vUpper;
  double vLower;
  double in_stack_ffffffffffffff78;
  HighsCDouble *in_stack_ffffffffffffff80;
  double local_40;
  double local_38;
  
  iVar4 = (int)__filename;
  if (this->implVarLowerSource[in_EDX] == iVar4) {
    local_38 = this->varLower[in_EDX];
  }
  else {
    pdVar1 = std::max<double>(this->implVarLower + in_EDX,this->varLower + in_EDX);
    local_38 = *pdVar1;
  }
  if (this->implVarUpperSource[in_EDX] == iVar4) {
    local_40 = this->varUpper[in_EDX];
  }
  else {
    pdVar1 = std::min<double>(this->implVarUpper + in_EDX,this->varUpper + in_EDX);
    local_40 = *pdVar1;
  }
  if (in_XMM0_Qa <= 0.0) {
    if ((local_40 != INFINITY) || (NAN(local_40))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                (&this->sumLower,(long)iVar4);
      HighsCDouble::operator-=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->numInfSumLower,(long)iVar4)
      ;
      *pvVar2 = *pvVar2 + -1;
    }
    if ((local_38 != -INFINITY) || (NAN(local_38))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                (&this->sumUpper,(long)iVar4);
      HighsCDouble::operator-=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->numInfSumUpper,(long)iVar4)
      ;
      *pvVar2 = *pvVar2 + -1;
    }
    if ((this->varUpper[in_EDX] != INFINITY) || (NAN(this->varUpper[in_EDX]))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                (&this->sumLowerOrig,(long)iVar4);
      HighsCDouble::operator-=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->numInfSumLowerOrig,(long)iVar4);
      *pvVar2 = *pvVar2 + -1;
    }
    if ((this->varLower[in_EDX] != -INFINITY) || (NAN(this->varLower[in_EDX]))) {
      pHVar3 = (HighsCDouble *)(this->varLower[in_EDX] * in_XMM0_Qa);
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                (&this->sumUpperOrig,(long)iVar4);
      pHVar3 = HighsCDouble::operator-=(pHVar3,in_stack_ffffffffffffff78);
    }
    else {
      pHVar3 = (HighsCDouble *)
               std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->numInfSumUpperOrig,(long)iVar4);
      *(int *)&pHVar3->hi = *(int *)&pHVar3->hi + -1;
    }
    iVar4 = (int)pHVar3;
  }
  else {
    if ((local_38 != -INFINITY) || (NAN(local_38))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                (&this->sumLower,(long)iVar4);
      HighsCDouble::operator-=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->numInfSumLower,(long)iVar4)
      ;
      *pvVar2 = *pvVar2 + -1;
    }
    if ((local_40 != INFINITY) || (NAN(local_40))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                (&this->sumUpper,(long)iVar4);
      HighsCDouble::operator-=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->numInfSumUpper,(long)iVar4)
      ;
      *pvVar2 = *pvVar2 + -1;
    }
    if ((this->varLower[in_EDX] != -INFINITY) || (NAN(this->varLower[in_EDX]))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                (&this->sumLowerOrig,(long)iVar4);
      HighsCDouble::operator-=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->numInfSumLowerOrig,(long)iVar4);
      *pvVar2 = *pvVar2 + -1;
    }
    if ((this->varUpper[in_EDX] != INFINITY) || (NAN(this->varUpper[in_EDX]))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                (&this->sumUpperOrig,(long)iVar4);
      pHVar3 = HighsCDouble::operator-=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      pHVar3 = (HighsCDouble *)
               std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->numInfSumUpperOrig,(long)iVar4);
      *(int *)&pHVar3->hi = *(int *)&pHVar3->hi + -1;
    }
    iVar4 = (int)pHVar3;
  }
  return iVar4;
}

Assistant:

void HighsLinearSumBounds::remove(HighsInt sum, HighsInt var,
                                  double coefficient) {
  double vLower = implVarLowerSource[var] == sum
                      ? varLower[var]
                      : std::max(implVarLower[var], varLower[var]);
  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (coefficient > 0) {
    // coefficient is positive, therefore variable lower contributes to sum
    // lower bound
    if (vLower == -kHighsInf)
      numInfSumLower[sum] -= 1;
    else
      sumLower[sum] -= vLower * coefficient;

    if (vUpper == kHighsInf)
      numInfSumUpper[sum] -= 1;
    else
      sumUpper[sum] -= vUpper * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= varLower[var] * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= varUpper[var] * coefficient;
  } else {
    // coefficient is negative, therefore variable upper contributes to sum
    // lower bound
    if (vUpper == kHighsInf)
      numInfSumLower[sum] -= 1;
    else
      sumLower[sum] -= vUpper * coefficient;

    if (vLower == -kHighsInf)
      numInfSumUpper[sum] -= 1;
    else
      sumUpper[sum] -= vLower * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= varUpper[var] * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= varLower[var] * coefficient;
  }
}